

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

void udp_recv_data(udp_ep *ep,udp_sp_data *dreq,size_t len,nng_sockaddr *sa)

{
  nni_msg *pnVar1;
  nni_time msg_00;
  nng_sockaddr *pnVar2;
  _Bool _Var3;
  int iVar4;
  size_t sVar5;
  void *__dest;
  void *__src;
  nng_sockaddr *pnVar6;
  udp_sp_data *clp;
  byte local_79;
  nni_msg *local_58;
  nni_msg *old;
  uint32_t peer_id;
  uint32_t send_id;
  nni_time now;
  nni_msg *msg;
  nni_aio *aio;
  udp_pipe *p;
  nng_sockaddr *sa_local;
  size_t len_local;
  udp_sp_data *dreq_local;
  udp_ep *ep_local;
  
  old._4_4_ = dreq->us_sender_id;
  old._0_4_ = dreq->us_peer_id;
  p = (udp_pipe *)sa;
  sa_local = (nng_sockaddr *)len;
  len_local = (size_t)dreq;
  dreq_local = (udp_sp_data *)ep;
  aio = (nni_aio *)udp_find_pipe(ep,(uint32_t)old,old._4_4_);
  if (aio == (nni_aio *)0x0) {
    nni_stat_inc((nni_stat_item *)&dreq_local[0x8f].us_sequence,1);
    udp_send_disc_full((udp_ep *)dreq_local,(nng_sockaddr *)p,old._4_4_,(uint32_t)old,0,DISC_NOTCONN
                      );
  }
  else if ((aio->a_task).task_cv.cv.__data.__g_signals[0] == 0) {
    nni_stat_inc((nni_stat_item *)&dreq_local[0x8f].us_sequence,1);
    udp_send_creq((udp_ep *)dreq_local,(udp_pipe *)aio);
  }
  else {
    _peer_id = nni_clock();
    if ((sa_local < (nng_sockaddr *)(ulong)*(ushort *)(len_local + 0x10)) ||
       (*(ushort *)((long)&(aio->a_task).task_cv.mtx + 6) < *(ushort *)(len_local + 0x10))) {
      nni_stat_inc((nni_stat_item *)&dreq_local[0x8c].us_peer_id,1);
      udp_send_disc((udp_ep *)dreq_local,(udp_pipe *)aio,DISC_MSGSIZE);
    }
    else {
      aio->a_iov[1].iov_len = _peer_id + (long)(*(int *)((long)&aio->a_iov[0].iov_buf + 4) * 5);
      aio->a_iov[0].iov_len = _peer_id + (long)*(int *)((long)&aio->a_iov[0].iov_buf + 4);
      udp_pipe_schedule((udp_pipe *)aio);
      pnVar1 = *(nni_msg **)&dreq_local[0x33].us_sender_id;
      sVar5 = nni_msg_len(*(nni_msg **)&dreq_local[0x33].us_sender_id);
      nni_msg_chop(pnVar1,sVar5 - *(ushort *)(len_local + 0x10));
      _Var3 = udp_check_pipe_sequence((udp_pipe *)aio,*(uint32_t *)(len_local + 0xc));
      if (_Var3) {
        _Var3 = nni_lmq_full((nni_lmq *)(aio->a_iov + 3));
        if (_Var3) {
          nni_lmq_get((nni_lmq *)(aio->a_iov + 3),&local_58);
          nni_msg_free(local_58);
          nni_stat_inc((nni_stat_item *)&dreq_local[0x99].us_sender_id,1);
        }
        if ((nng_sockaddr *)(ulong)*(ushort *)((long)&dreq_local[0x82].us_peer_id + 2) < sa_local) {
          nni_stat_inc((nni_stat_item *)(dreq_local + 0x96),1);
          now._0_4_ = dreq_local[0x33].us_sender_id;
          now._4_4_ = dreq_local[0x33].us_peer_id;
          iVar4 = nng_msg_alloc((nng_msg **)&dreq_local[0x33].us_sender_id,
                                (ulong)(ushort)dreq_local[0x82].us_peer_id);
          pnVar2 = sa_local;
          if (iVar4 != 0) {
            dreq_local[0x33].us_sender_id = (undefined4)now;
            dreq_local[0x33].us_peer_id = now._4_4_;
            if (aio->a_expire == 0) {
              return;
            }
            nni_pipe_bump_error((nni_pipe *)aio->a_expire,2);
            return;
          }
          pnVar6 = (nng_sockaddr *)nng_msg_len((nng_msg *)now);
          msg_00 = now;
          if (pnVar6 < pnVar2) {
            sVar5 = nng_msg_len((nng_msg *)now);
            nng_msg_chop((nng_msg *)msg_00,sVar5 - (long)sa_local);
          }
          nni_msg_set_address((nng_msg *)now,(nng_sockaddr *)p);
          nni_lmq_put((nni_lmq *)(aio->a_iov + 3),(nng_msg *)now);
        }
        else {
          nni_stat_inc((nni_stat_item *)&dreq_local[0x92].us_length,1);
          iVar4 = nng_msg_alloc((nng_msg **)&now,(size_t)sa_local);
          if (iVar4 != 0) {
            if (aio->a_expire == 0) {
              return;
            }
            nni_pipe_bump_error((nni_pipe *)aio->a_expire,2);
            return;
          }
          nni_msg_set_address((nng_msg *)now,(nng_sockaddr *)p);
          __dest = nni_msg_body((nni_msg *)now);
          __src = nni_msg_body(*(nni_msg **)&dreq_local[0x33].us_sender_id);
          memcpy(__dest,__src,(size_t)sa_local);
          nni_lmq_put((nni_lmq *)(aio->a_iov + 3),(nng_msg *)now);
          nni_msg_realloc(*(nni_msg **)&dreq_local[0x33].us_sender_id,
                          (ulong)(ushort)dreq_local[0x82].us_peer_id);
        }
        while( true ) {
          msg = (nni_msg *)nni_list_first((nni_list *)&aio->a_iov[7].iov_len);
          local_79 = 0;
          if (msg != (nni_msg *)0x0) {
            _Var3 = nni_lmq_empty((nni_lmq *)(aio->a_iov + 3));
            local_79 = _Var3 ^ 0xff;
          }
          if ((local_79 & 1) == 0) break;
          nni_aio_list_remove((nni_aio *)msg);
          nni_lmq_get((nni_lmq *)(aio->a_iov + 3),(nng_msg **)&now);
          nni_aio_set_msg((nni_aio *)msg,(nni_msg *)now);
          pnVar1 = msg;
          clp = dreq_local + 0x84;
          sVar5 = nni_aio_count((nni_aio *)msg);
          nni_aio_completions_add((nni_aio_completions *)clp,(nni_aio *)pnVar1,NNG_OK,sVar5);
        }
      }
    }
  }
  return;
}

Assistant:

static void
udp_recv_data(udp_ep *ep, udp_sp_data *dreq, size_t len, nng_sockaddr *sa)
{
	// NB: ep mtx is locked
	udp_pipe *p;
	nni_aio  *aio;
	nni_msg  *msg;
	nni_time  now;

	// send_id is the remote peer's ID
	// peer_id is our ID (receiver ID)
	// sequence number is our sender's sequence
	uint32_t send_id = dreq->us_sender_id;
	uint32_t peer_id = dreq->us_peer_id;

	// NB: Peer ID endianness does not matter, as long we use it
	// consistently.
	if ((p = udp_find_pipe(ep, peer_id, send_id)) == NULL) {
		nni_stat_inc(&ep->st_rcv_nomatch, 1);
		udp_send_disc_full(ep, sa, send_id, peer_id, 0, DISC_NOTCONN);
		// Question: how do we store the sockaddr for that?
		return;
	}
	if (p->peer_id == 0) {
		// connection isn't formed yet ... send another CREQ
		nni_stat_inc(&ep->st_rcv_nomatch, 1);
		udp_send_creq(ep, p);
		return;
	}

	now = nni_clock();

	// Make sure the message wasn't truncated, and that it fits within
	// our maximum agreed upon payload.
	if ((dreq->us_length > len) || (dreq->us_length > p->rcvmax)) {
		nni_stat_inc(&ep->st_rcv_toobig, 1);
		udp_send_disc(ep, p, DISC_MSGSIZE);
		return;
	}

	p->expire    = now + UDP_PIPE_TIMEOUT(p);
	p->next_wake = now + UDP_PIPE_REFRESH(p);

	udp_pipe_schedule(p);

	// trim the message down to its
	nni_msg_chop(
	    ep->rx_payload, nni_msg_len(ep->rx_payload) - dreq->us_length);

	if (!udp_check_pipe_sequence(p, dreq->us_sequence)) {
		// out of order delivery, drop it
		return;
	}

	// We have a choice to make.  Drop this message (easiest), or
	// drop the oldest.  We drop the oldest because generally we
	// find that applications prefer to have more recent data rather
	// than keeping stale data.
	if (nni_lmq_full(&p->rx_mq)) {
		nni_msg *old;
		(void) nni_lmq_get(&p->rx_mq, &old);
		nni_msg_free(old);
		nni_stat_inc(&ep->st_rcv_nobuf, 1);
	}

	// Short message, just alloc and copy
	if (len <= ep->copymax) {
		nni_stat_inc(&ep->st_rcv_copy, 1);
		if (nng_msg_alloc(&msg, len) != 0) {
			if (p->npipe != NULL) {
				nni_pipe_bump_error(p->npipe, NNG_ENOMEM);
			}
			return;
		}
		nni_msg_set_address(msg, sa);
		memcpy(nni_msg_body(msg), nni_msg_body(ep->rx_payload), len);
		nni_lmq_put(&p->rx_mq, msg);
		nni_msg_realloc(ep->rx_payload, ep->rcvmax);
	} else {
		nni_stat_inc(&ep->st_rcv_nocopy, 1);
		// Message size larger than copy break, do zero copy
		msg = ep->rx_payload;
		if (nng_msg_alloc(&ep->rx_payload, ep->rcvmax) != 0) {
			ep->rx_payload = msg; // make sure we put it back
			if (p->npipe != NULL) {
				nni_pipe_bump_error(p->npipe, NNG_ENOMEM);
			}
			return;
		}

		if (len > nng_msg_len(msg)) {
			// chop off any unfilled tail
			nng_msg_chop(msg, nng_msg_len(msg) - len);
		}
		nni_msg_set_address(msg, sa);
		nni_lmq_put(&p->rx_mq, msg);
	}

	while (((aio = nni_list_first(&p->rx_aios)) != NULL) &&
	    (!nni_lmq_empty(&p->rx_mq))) {
		nni_aio_list_remove(aio);
		nni_lmq_get(&p->rx_mq, &msg);
		nni_aio_set_msg(aio, msg);
		nni_aio_completions_add(
		    &ep->complq, aio, 0, nni_aio_count(aio));
	}
}